

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall spirv_cross::CompilerMSL::get_uint_type_id(CompilerMSL *this)

{
  uint32_t uVar1;
  undefined1 local_178 [208];
  uint *local_a8;
  size_t local_a0;
  size_t local_98;
  uint local_90 [8];
  undefined1 local_70 [28];
  TypeID local_54;
  __node_base_ptr *local_50;
  size_type local_48;
  __node_base local_40;
  size_type sStack_38;
  float local_30;
  size_t local_28;
  __node_base_ptr p_Stack_20;
  
  uVar1 = this->uint_type_id;
  if (uVar1 == 0) {
    uVar1 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    this->uint_type_id = uVar1;
    local_178._32_8_ = local_178 + 0x38;
    local_178._8_8_ = 0x1500000000;
    local_178._0_8_ = &PTR__SPIRType_0047ef28;
    local_178._24_4_ = 1;
    local_178._28_4_ = 1;
    local_178._40_8_ = 0;
    local_178._48_8_ = 8;
    local_178._88_8_ = local_178 + 0x70;
    local_178._96_8_ = 0;
    local_178._104_8_ = 8;
    local_178._120_4_ = 0;
    local_178[0x7c] = false;
    local_178[0x7d] = false;
    local_178._128_4_ = 0;
    local_178._132_4_ = 0;
    local_178._136_4_ = 0;
    local_178._140_4_ = 0;
    local_178._144_4_ = Generic;
    local_178._152_8_ = local_178 + 0xb0;
    local_178._160_8_ = 0;
    local_178._168_8_ = 8;
    local_a8 = local_90;
    local_a0 = 0;
    local_98 = 8;
    local_50 = &p_Stack_20;
    local_70._0_7_ = 0;
    local_70._7_4_ = 0;
    local_54.id = 0;
    local_70._12_4_ = 0;
    local_70._16_4_ = ImageFormatUnknown;
    local_70._20_4_ = AccessQualifierReadOnly;
    local_70._24_4_ = 0;
    local_48 = 1;
    local_40._M_nxt = (_Hash_node_base *)0x0;
    sStack_38 = 0;
    local_30 = 1.0;
    local_28 = 0;
    p_Stack_20 = (__node_base_ptr)0x0;
    local_178._16_4_ = UInt;
    local_178._20_4_ = 0x20;
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              ((Compiler *)this,uVar1,(SPIRType *)local_178);
    uVar1 = this->uint_type_id;
    SPIRType::~SPIRType((SPIRType *)local_178);
  }
  return uVar1;
}

Assistant:

uint32_t CompilerMSL::get_uint_type_id()
{
	if (uint_type_id != 0)
		return uint_type_id;

	uint_type_id = ir.increase_bound_by(1);

	SPIRType type { OpTypeInt };
	type.basetype = SPIRType::UInt;
	type.width = 32;
	set<SPIRType>(uint_type_id, type);
	return uint_type_id;
}